

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O1

void __thiscall imrt::EvaluationFunction::generate_voxel_dose_functions(EvaluationFunction *this)

{
  _Base_ptr *pp_Var1;
  double dVar2;
  pointer pvVar3;
  pointer __s;
  pointer pdVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  ostream *poVar9;
  _Rb_tree_node_base *p_Var10;
  undefined8 *puVar11;
  long lVar12;
  ulong uVar13;
  long *plVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  string __str_1;
  set<double,_std::greater<double>,_std::allocator<double>_> dose;
  string __str;
  ofstream myfile;
  double local_2d8;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long local_290;
  _Rb_tree<double,_double,_std::_Identity<double>,_std::greater<double>,_std::allocator<double>_>
  local_288;
  undefined8 local_258;
  char *local_250 [2];
  char local_240 [16];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  lVar19 = _VTT;
  if (0 < this->nb_organs) {
    local_290 = __filebuf;
    uVar17 = 0;
    do {
      local_288._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_288._M_impl.super__Rb_tree_header._M_header;
      local_288._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_288._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_288._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_288._M_impl.super__Rb_tree_header._M_node_count = 0;
      pvVar3 = (this->voxel_dose).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __s = pvVar3[uVar17].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
      pdVar4 = *(pointer *)
                ((long)&pvVar3[uVar17].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + 8);
      local_288._M_impl.super__Rb_tree_header._M_header._M_right =
           local_288._M_impl.super__Rb_tree_header._M_header._M_left;
      if (__s != pdVar4) {
        memset(__s,0,((long)pdVar4 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
      }
      if (0 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17]) {
        lVar15 = 0;
        lVar16 = 0;
        do {
          std::
          _Rb_tree<double,double,std::_Identity<double>,std::greater<double>,std::allocator<double>>
          ::_M_insert_unique<double_const&>
                    ((_Rb_tree<double,double,std::_Identity<double>,std::greater<double>,std::allocator<double>>
                      *)&local_288,
                     (double *)
                     (*(long *)&(this->Z).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + lVar15));
          dVar2 = *(double *)
                   (*(long *)&(this->Z).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar17].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + lVar15);
          if (dVar2 < 150.0) {
            lVar12 = (long)(int)dVar2;
            lVar5 = *(long *)&(this->voxel_dose).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar17].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            *(double *)(lVar5 + lVar12 * 8) = *(double *)(lVar5 + lVar12 * 8) + 1.0;
          }
          lVar16 = lVar16 + 1;
          lVar15 = lVar15 + 8;
        } while (lVar16 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar17]);
      }
      std::ofstream::ofstream((string *)&local_230);
      uVar18 = 1;
      if (9 < uVar17) {
        uVar6 = 4;
        uVar13 = uVar17;
        do {
          uVar18 = uVar6;
          uVar7 = (uint)uVar13;
          if (uVar7 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_0012a935;
          }
          if (uVar7 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_0012a935;
          }
          if (uVar7 < 10000) goto LAB_0012a935;
          uVar13 = (uVar13 & 0xffffffff) / 10000;
          uVar6 = uVar18 + 4;
        } while (99999 < uVar7);
        uVar18 = uVar18 + 1;
      }
LAB_0012a935:
      local_250[0] = local_240;
      std::__cxx11::string::_M_construct((ulong)local_250,(char)uVar18);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_250[0],uVar18,(uint)uVar17);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x12e4ec);
      plVar14 = plVar8 + 2;
      if ((long *)*plVar8 == plVar14) {
        local_2c0 = *plVar14;
        lStack_2b8 = plVar8[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0 = *plVar14;
        local_2d0 = (long *)*plVar8;
      }
      local_2c8 = plVar8[1];
      *plVar8 = (long)plVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      plVar14 = plVar8 + 2;
      if ((long *)*plVar8 == plVar14) {
        local_2a0 = *plVar14;
        lStack_298 = plVar8[3];
        local_2b0 = &local_2a0;
      }
      else {
        local_2a0 = *plVar14;
        local_2b0 = (long *)*plVar8;
      }
      local_2a8 = plVar8[1];
      *plVar8 = (long)plVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_2b0);
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0);
      }
      p_Var10 = local_288._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_250[0] != local_240) {
        operator_delete(local_250[0]);
        p_Var10 = local_288._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      for (; (_Rb_tree_header *)p_Var10 != &local_288._M_impl.super__Rb_tree_header;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        poVar9 = std::ostream::_M_insert<double>(*(double *)(p_Var10 + 1));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      std::ofstream::close();
      local_230 = lVar19;
      *(long *)(local_228 + *(long *)(lVar19 + -0x18) + -8) = local_290;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      std::
      _Rb_tree<double,_double,_std::_Identity<double>,_std::greater<double>,_std::allocator<double>_>
      ::~_Rb_tree(&local_288);
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < (long)this->nb_organs);
  }
  if (0 < this->nb_organs) {
    local_290 = _VTT;
    local_258 = __filebuf;
    uVar17 = 0;
    do {
      std::ofstream::ofstream((string *)&local_230);
      uVar18 = 1;
      if (9 < uVar17) {
        uVar6 = 4;
        uVar13 = uVar17;
        do {
          uVar18 = uVar6;
          uVar7 = (uint)uVar13;
          if (uVar7 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_0012abaf;
          }
          if (uVar7 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_0012abaf;
          }
          if (uVar7 < 10000) goto LAB_0012abaf;
          uVar13 = (uVar13 & 0xffffffff) / 10000;
          uVar6 = uVar18 + 4;
        } while (99999 < uVar7);
        uVar18 = uVar18 + 1;
      }
LAB_0012abaf:
      local_2d0 = &local_2c0;
      std::__cxx11::string::_M_construct((ulong)&local_2d0,(char)uVar18);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2d0,uVar18,(uint)uVar17);
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,0x12e503);
      plVar8 = puVar11 + 2;
      pp_Var1 = &local_288._M_impl.super__Rb_tree_header._M_header._M_parent;
      if ((long *)*puVar11 == plVar8) {
        local_2a0 = *plVar8;
        lStack_298 = puVar11[3];
        local_2b0 = &local_2a0;
      }
      else {
        local_2a0 = *plVar8;
        local_2b0 = (long *)*puVar11;
      }
      local_2a8 = puVar11[1];
      *puVar11 = plVar8;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      plVar14 = plVar8 + 2;
      if ((_Base_ptr *)*plVar8 == (_Base_ptr *)plVar14) {
        local_288._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar14;
        local_288._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar8[3];
        local_288._M_impl._0_8_ = pp_Var1;
      }
      else {
        local_288._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar14;
        local_288._M_impl._0_8_ = (_Base_ptr *)*plVar8;
      }
      local_288._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar8[1];
      *plVar8 = (long)plVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_288);
      if ((_Base_ptr *)local_288._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)local_288._M_impl._0_8_);
      }
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0);
      }
      local_2d8 = 0.0;
      lVar19 = 0x96;
      do {
        local_2d8 = local_2d8 +
                    *(double *)
                     (*(long *)&(this->voxel_dose).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + -8 + lVar19 * 8);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)lVar19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
        poVar9 = std::ostream::_M_insert<double>
                           (local_2d8 /
                            (double)(this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar17]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
      std::ofstream::close();
      local_230 = local_290;
      *(undefined8 *)(local_228 + *(long *)(local_290 + -0x18) + -8) = local_258;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < (long)this->nb_organs);
  }
  return;
}

Assistant:

void EvaluationFunction::generate_voxel_dose_functions (){

	for(int o=0; o<nb_organs; o++){
		std::set<double, std::greater<double> > dose;
		std::fill(voxel_dose[o].begin(), voxel_dose[o].end(), 0.0);
		for(int k=0; k<nb_voxels[o]; k++){

			dose.insert(Z[o][k]);
			if(Z[o][k]<150)
				voxel_dose[o][(int) Z[o][k]]+=1;
		}

		ofstream myfile;
		myfile.open ("plotter/organ_xls"+std::to_string(o)+".dat");
		for(auto v:dose){
			myfile << v << endl;
		}
		myfile.close();

	}


	for(int o=0; o<nb_organs; o++){
		ofstream myfile;
		myfile.open ("plotter/organ"+std::to_string(o)+".txt");

		double cum=0.0;
		for(int k=149; k>=0; k--){
			cum+= voxel_dose[o][k];
			myfile << k+1 << "," << cum/nb_voxels[o] << endl;
		}

		myfile.close();
	}
}